

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Apu.cpp
# Opt level: O0

void gen_poly(blargg_ulong mask,int count,byte_ *out)

{
  bool bVar1;
  int b;
  int bits;
  blargg_ulong n;
  byte_ *out_local;
  int count_local;
  blargg_ulong mask_local;
  
  n = 1;
  out_local = out;
  count_local = count;
  do {
    bits = 0;
    b = 0;
    do {
      bits = (n & 1) << ((byte)b & 0x1f) | bits;
      n = n >> 1 ^ mask & -(n & 1);
      bVar1 = b < 7;
      b = b + 1;
    } while (bVar1);
    *out_local = (byte_)bits;
    count_local = count_local + -1;
    out_local = out_local + 1;
  } while (count_local != 0);
  return;
}

Assistant:

static void gen_poly( blargg_ulong mask, int count, byte* out )
{
	blargg_ulong n = 1;
	do
	{
		int bits = 0;
		int b = 0;
		do
		{
			// implemented using "Galios configuration"
			bits |= (n & 1) << b;
			n = (n >> 1) ^ (mask & (blargg_ulong)-(blargg_long)(n & 1));
		}
		while ( b++ < 7 );
		*out++ = bits;
	}
	while ( --count );
}